

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O1

int I210ToARGBMatrix(uint16_t *src_y,int src_stride_y,uint16_t *src_u,int src_stride_u,
                    uint16_t *src_v,int src_stride_v,uint8_t *dst_argb,int dst_stride_argb,
                    YuvConstants *yuvconstants,int width,int height)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  code *pcVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(src_y == (uint16_t *)0x0);
  auVar6._4_4_ = -(uint)(src_u == (uint16_t *)0x0);
  auVar6._8_4_ = -(uint)(src_v == (uint16_t *)0x0);
  auVar6._12_4_ = -(uint)(dst_argb == (uint8_t *)0x0);
  iVar3 = movmskps((int)src_u,auVar6);
  iVar2 = -1;
  if ((height != 0 && 0 < width) && iVar3 == 0) {
    iVar3 = height;
    if (height < 0) {
      iVar3 = -height;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar5 = I210ToARGBRow_SSSE3;
    }
    else {
      pcVar5 = I210ToARGBRow_Any_SSSE3;
    }
    if ((uVar1 & 0x40) == 0) {
      pcVar5 = I210ToARGBRow_C;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar4 = I210ToARGBRow_AVX2;
    }
    else {
      pcVar4 = I210ToARGBRow_Any_AVX2;
    }
    if ((uVar1 >> 10 & 1) == 0) {
      pcVar4 = pcVar5;
    }
    iVar2 = 0;
    if (0 < iVar3) {
      do {
        (*pcVar4)(src_y,src_u,src_v,dst_argb,yuvconstants,width);
        dst_argb = dst_argb + dst_stride_argb;
        src_y = src_y + src_stride_y;
        src_u = src_u + src_stride_u;
        src_v = src_v + src_stride_v;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

LIBYUV_API
int I210ToARGBMatrix(const uint16_t* src_y,
                     int src_stride_y,
                     const uint16_t* src_u,
                     int src_stride_u,
                     const uint16_t* src_v,
                     int src_stride_v,
                     uint8_t* dst_argb,
                     int dst_stride_argb,
                     const struct YuvConstants* yuvconstants,
                     int width,
                     int height) {
  int y;
  void (*I210ToARGBRow)(const uint16_t* y_buf, const uint16_t* u_buf,
                        const uint16_t* v_buf, uint8_t* rgb_buf,
                        const struct YuvConstants* yuvconstants, int width) =
      I210ToARGBRow_C;
  if (!src_y || !src_u || !src_v || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
#if defined(HAS_I210TOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I210ToARGBRow = I210ToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I210ToARGBRow = I210ToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_I210TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I210ToARGBRow = I210ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I210ToARGBRow = I210ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_I210TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I210ToARGBRow = I210ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I210ToARGBRow = I210ToARGBRow_MMI;
    }
  }
#endif
  for (y = 0; y < height; ++y) {
    I210ToARGBRow(src_y, src_u, src_v, dst_argb, yuvconstants, width);
    dst_argb += dst_stride_argb;
    src_y += src_stride_y;
    src_u += src_stride_u;
    src_v += src_stride_v;
  }
  return 0;
}